

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

ssize_t getPassword(uint8_t *prompt,uint8_t *line_buff,size_t buff_size,FILE *stream)

{
  int iVar1;
  int __fd;
  __ssize_t _Var2;
  ssize_t sVar3;
  termios old;
  termios new;
  uint8_t *local_a8;
  size_t local_a0;
  termios local_94;
  termios local_58;
  
  local_a8 = line_buff;
  local_a0 = buff_size;
  if (prompt != (uint8_t *)0x0) {
    puts((char *)prompt);
  }
  iVar1 = fileno((FILE *)stream);
  iVar1 = tcgetattr(iVar1,&local_94);
  sVar3 = -1;
  if (iVar1 == 0) {
    local_58.c_iflag = local_94.c_iflag;
    local_58.c_oflag = local_94.c_oflag;
    local_58.c_ispeed = local_94.c_ispeed;
    local_58.c_ospeed = local_94.c_ospeed;
    local_58.c_cc[0xf] = local_94.c_cc[0xf];
    local_58.c_cc[0x10] = local_94.c_cc[0x10];
    local_58.c_cc[0x11] = local_94.c_cc[0x11];
    local_58.c_cc[0x12] = local_94.c_cc[0x12];
    local_58.c_cc[0x13] = local_94.c_cc[0x13];
    local_58.c_cc[0x14] = local_94.c_cc[0x14];
    local_58.c_cc[0x15] = local_94.c_cc[0x15];
    local_58.c_cc[0x16] = local_94.c_cc[0x16];
    local_58.c_line = local_94.c_line;
    local_58.c_cc[0] = local_94.c_cc[0];
    local_58.c_cc[1] = local_94.c_cc[1];
    local_58.c_cc[2] = local_94.c_cc[2];
    local_58.c_cc[3] = local_94.c_cc[3];
    local_58.c_cc[4] = local_94.c_cc[4];
    local_58.c_cc[5] = local_94.c_cc[5];
    local_58.c_cc[6] = local_94.c_cc[6];
    local_58.c_cc[7] = local_94.c_cc[7];
    local_58.c_cc[8] = local_94.c_cc[8];
    local_58.c_cc[9] = local_94.c_cc[9];
    local_58.c_cc[10] = local_94.c_cc[10];
    local_58.c_cc[0xb] = local_94.c_cc[0xb];
    local_58.c_cc[0xc] = local_94.c_cc[0xc];
    local_58.c_cc[0xd] = local_94.c_cc[0xd];
    local_58.c_cc[0xe] = local_94.c_cc[0xe];
    local_58._8_8_ = local_94._8_8_ & 0xfffffff7ffffffff;
    iVar1 = fileno((FILE *)stream);
    iVar1 = tcsetattr(iVar1,2,&local_58);
    if (iVar1 == 0) {
      _Var2 = getline((char **)&local_a8,&local_a0,(FILE *)stream);
      iVar1 = (int)_Var2;
      if (0 < iVar1) {
        if (local_a8[iVar1 - 1U] == '\n') {
          local_a8[iVar1 - 1U] = '\0';
          iVar1 = iVar1 + -1;
        }
      }
      __fd = fileno((FILE *)stream);
      tcsetattr(__fd,2,&local_94);
      sVar3 = (ssize_t)iVar1;
    }
  }
  return sVar3;
}

Assistant:

ssize_t getPassword(uint8_t* prompt, uint8_t* line_buff, size_t buff_size, FILE* stream)
{
    struct termios old, new;
    int nread = -1;

    /* Display the prompt */
    if (prompt != NULL) { printf("%s\n", prompt); }

    /* Turn off echoing and fail if we can't */
    if (tcgetattr(fileno(stream), &old) != 0) { return nread; }

    new = old;
    new.c_lflag &= ~ECHO;

    if (tcsetattr(fileno(stream), TCSAFLUSH, &new) != 0) { return nread; }

    /* Read the password. */
    nread = getline((char**)&line_buff, &buff_size, stream);

    /* Strip out the carriage return */
    if(nread >= 1 && line_buff[nread -1] == '\n')
    {
        line_buff[nread-1] = 0;
        nread--;
    }

    /* turn echo back on */
    (void)tcsetattr(fileno(stream), TCSAFLUSH, &old);

    return nread;
}